

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arccurve.cpp
# Opt level: O0

bool NurbsCurveArc(ON_Arc *arc,int dim,ON_NurbsCurve *nurb)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  ON_3dPoint *pOVar8;
  double *pdVar9;
  int iVar10;
  ON_3dPoint local_350;
  ON_3dPoint local_338;
  ON_3dPoint local_320;
  ON_3dPoint local_308;
  ON_3dPoint local_2f0;
  ON_3dPoint local_2d8;
  ON_3dPoint local_2c0;
  ON_3dPoint local_2a8;
  ON_3dPoint local_290;
  ON_3dPoint local_278;
  ON_3dPoint local_260;
  int local_244;
  int local_240;
  int cv_count;
  int span_count;
  int j;
  double *cv;
  double winv;
  double w;
  double c;
  double b;
  double a;
  double knot [10];
  ON_4dPoint CV [9];
  ON_3dPoint end_point;
  ON_3dPoint start_point;
  double angle1;
  double angle0;
  ON_Interval dom;
  double angle;
  ON_3dPoint center;
  ON_NurbsCurve *nurb_local;
  int dim_local;
  ON_Arc *arc_local;
  
  bVar7 = ON_Arc::IsValid(arc);
  if (bVar7) {
    pOVar8 = ON_Circle::Center(&arc->super_ON_Circle);
    dVar3 = pOVar8->x;
    dVar4 = pOVar8->y;
    dVar5 = pOVar8->z;
    dom.m_t[1] = ON_Arc::AngleRadians(arc);
    _angle0 = ON_Arc::DomainRadians(arc);
    pdVar9 = ON_Interval::operator[]((ON_Interval *)&angle0,0);
    dVar1 = *pdVar9;
    pdVar9 = ON_Interval::operator[]((ON_Interval *)&angle0,1);
    dVar2 = *pdVar9;
    ON_Arc::StartPoint((ON_3dPoint *)&end_point.z,arc);
    bVar7 = ON_Arc::IsCircle(arc);
    if (bVar7) {
      CV[8].w = end_point.z;
    }
    else {
      ON_Arc::EndPoint((ON_3dPoint *)&CV[8].w,arc);
    }
    b = 1.570796373608275;
    if (1.570796373608275 < dom.m_t[1]) {
      if (3.14159274721655 < dom.m_t[1]) {
        local_240 = 4;
      }
      else {
        local_240 = 2;
      }
    }
    else {
      local_240 = 1;
    }
    local_244 = local_240 * 2 + 1;
    if (local_240 == 1) {
      ON_4dPoint::operator=((ON_4dPoint *)(knot + 9),(ON_3dPoint *)&end_point.z);
      ON_Circle::PointAt(&local_260,&arc->super_ON_Circle,dom.m_t[1] * 0.5 + dVar1);
      ON_4dPoint::operator=((ON_4dPoint *)&CV[0].w,&local_260);
      ON_4dPoint::operator=((ON_4dPoint *)&CV[1].w,(ON_3dPoint *)&CV[8].w);
    }
    else if (local_240 == 2) {
      ON_4dPoint::operator=((ON_4dPoint *)(knot + 9),(ON_3dPoint *)&end_point.z);
      ON_Circle::PointAt(&local_278,&arc->super_ON_Circle,dom.m_t[1] * 0.25 + dVar1);
      ON_4dPoint::operator=((ON_4dPoint *)&CV[0].w,&local_278);
      ON_Circle::PointAt(&local_290,&arc->super_ON_Circle,dom.m_t[1] * 0.5 + dVar1);
      ON_4dPoint::operator=((ON_4dPoint *)&CV[1].w,&local_290);
      ON_Circle::PointAt(&local_2a8,&arc->super_ON_Circle,dom.m_t[1] * 0.75 + dVar1);
      ON_4dPoint::operator=((ON_4dPoint *)&CV[2].w,&local_2a8);
      ON_4dPoint::operator=((ON_4dPoint *)&CV[3].w,(ON_3dPoint *)&CV[8].w);
      dom.m_t[1] = dom.m_t[1] * 0.5;
    }
    else {
      ON_4dPoint::operator=((ON_4dPoint *)(knot + 9),(ON_3dPoint *)&end_point.z);
      ON_Circle::PointAt(&local_2c0,&arc->super_ON_Circle,dom.m_t[1] * 0.125 + dVar1);
      ON_4dPoint::operator=((ON_4dPoint *)&CV[0].w,&local_2c0);
      ON_Circle::PointAt(&local_2d8,&arc->super_ON_Circle,dom.m_t[1] * 0.25 + dVar1);
      ON_4dPoint::operator=((ON_4dPoint *)&CV[1].w,&local_2d8);
      ON_Circle::PointAt(&local_2f0,&arc->super_ON_Circle,dom.m_t[1] * 0.375 + dVar1);
      ON_4dPoint::operator=((ON_4dPoint *)&CV[2].w,&local_2f0);
      ON_Circle::PointAt(&local_308,&arc->super_ON_Circle,dom.m_t[1] * 0.5 + dVar1);
      ON_4dPoint::operator=((ON_4dPoint *)&CV[3].w,&local_308);
      ON_Circle::PointAt(&local_320,&arc->super_ON_Circle,dom.m_t[1] * 0.625 + dVar1);
      ON_4dPoint::operator=((ON_4dPoint *)&CV[4].w,&local_320);
      ON_Circle::PointAt(&local_338,&arc->super_ON_Circle,dom.m_t[1] * 0.75 + dVar1);
      ON_4dPoint::operator=((ON_4dPoint *)&CV[5].w,&local_338);
      ON_Circle::PointAt(&local_350,&arc->super_ON_Circle,dom.m_t[1] * 0.875 + dVar1);
      ON_4dPoint::operator=((ON_4dPoint *)&CV[6].w,&local_350);
      ON_4dPoint::operator=((ON_4dPoint *)&CV[7].w,(ON_3dPoint *)&CV[8].w);
      dom.m_t[1] = dom.m_t[1] * 0.25;
    }
    b = cos(dom.m_t[1] * 0.5);
    dVar6 = dom.m_t[1];
    c = b - 1.0;
    w = dom.m_t[1];
    local_240 = local_240 << 1;
    knot[0] = dVar1;
    a = dVar1;
    for (cv_count = 1; cv_count < local_240; cv_count = cv_count + 2) {
      CV[(long)cv_count + -1].w = c * dVar3 + CV[(long)cv_count + -1].w;
      CV[cv_count].x = c * dVar4 + CV[cv_count].x;
      CV[cv_count].y = c * dVar5 + CV[cv_count].y;
      CV[cv_count].z = b;
      CV[cv_count + 1].z = 1.0;
      dVar1 = knot[(long)(cv_count + -1) + -1];
      knot[(long)(cv_count + 2) + -1] = dVar1 + dVar6;
      knot[(long)(cv_count + 1) + -1] = dVar1 + dVar6;
    }
    knot[(long)local_244 + -1] = dVar2;
    knot[(long)(local_244 + -1) + -1] = dVar2;
    for (cv_count = 1; cv_count < local_240; cv_count = cv_count + 2) {
      winv = CV[cv_count].z;
      cv = (double *)(1.0 / winv);
      b = CV[(long)cv_count + -1].w * (double)cv;
      c = ArcDeFuzz(b);
      if ((b != c) || (NAN(b) || NAN(c))) {
        CV[(long)cv_count + -1].w = c * winv;
      }
      b = CV[cv_count].x * (double)cv;
      c = ArcDeFuzz(b);
      if ((b != c) || (NAN(b) || NAN(c))) {
        CV[cv_count].x = c * winv;
      }
      b = CV[cv_count].y * (double)cv;
      c = ArcDeFuzz(b);
      if ((b != c) || (NAN(b) || NAN(c))) {
        CV[cv_count].y = c * winv;
      }
    }
    iVar10 = 3;
    if (dim == 2) {
      iVar10 = 2;
    }
    nurb->m_dim = iVar10;
    nurb->m_is_rat = 1;
    nurb->m_order = 3;
    nurb->m_cv_count = local_244;
    iVar10 = 4;
    if (dim == 2) {
      iVar10 = 3;
    }
    nurb->m_cv_stride = iVar10;
    ON_NurbsCurve::ReserveCVCapacity(nurb,nurb->m_cv_stride * local_244);
    ON_NurbsCurve::ReserveKnotCapacity(nurb,local_244 + 1);
    for (cv_count = 0; cv_count < local_244; cv_count = cv_count + 1) {
      _span_count = ON_NurbsCurve::CV(nurb,cv_count);
      *_span_count = CV[(long)cv_count + -1].w;
      _span_count[1] = CV[cv_count].x;
      if (dim == 2) {
        _span_count[2] = CV[cv_count].z;
      }
      else {
        _span_count[2] = CV[cv_count].y;
        _span_count[3] = CV[cv_count].z;
      }
      nurb->m_knot[cv_count] = knot[(long)cv_count + -1];
    }
    nurb->m_knot[local_244] = knot[(long)local_244 + -1];
    arc_local._7_1_ = true;
  }
  else {
    arc_local._7_1_ = false;
  }
  return arc_local._7_1_;
}

Assistant:

static bool NurbsCurveArc ( const ON_Arc& arc, int dim, ON_NurbsCurve& nurb )
{ 
  if ( !arc.IsValid() )
    return false;
  // makes a quadratic nurbs arc
  const ON_3dPoint center = arc.Center();
  double angle = arc.AngleRadians();
  ON_Interval dom = arc.DomainRadians();
  const double angle0 = dom[0];
  const double angle1 = dom[1];
  ON_3dPoint start_point = arc.StartPoint();
  //ON_3dPoint mid_point   = arc.PointAt(angle0 + 0.5*angle);
  ON_3dPoint end_point   = arc.IsCircle() ? start_point : arc.EndPoint();

  ON_4dPoint CV[9];
  double knot[10];

	double a, b, c, w, winv;
	double *cv;
	int    j, span_count, cv_count;

	a = (0.5 + ON_SQRT_EPSILON)*ON_PI;

	if (angle <= a)
		span_count = 1;
	else if (angle <= 2.0*a)
		span_count = 2;
	else if (angle <= 3.0*a)
		span_count = 4; // TODO - make a 3 span case
	else
		span_count = 4;

	cv_count = 2*span_count + 1;
	
	switch(span_count) {
	case 1:
    CV[0] = start_point;
    CV[1] = arc.PointAt(angle0 + 0.50*angle);
    CV[2] = end_point;
		break;
	case 2:
    CV[0] = start_point;
    CV[1] = arc.PointAt(angle0 + 0.25*angle);
    CV[2] = arc.PointAt(angle0 + 0.50*angle);
    CV[3] = arc.PointAt(angle0 + 0.75*angle);
    CV[4] = end_point;
		angle *= 0.5;
		break;
	default: // 4 spans
    CV[0] = start_point;
    CV[1] = arc.PointAt(angle0 + 0.125*angle);
    CV[2] = arc.PointAt(angle0 + 0.250*angle);
    CV[3] = arc.PointAt(angle0 + 0.375*angle);
    CV[4] = arc.PointAt(angle0 + 0.500*angle);
    CV[5] = arc.PointAt(angle0 + 0.625*angle);
    CV[6] = arc.PointAt(angle0 + 0.750*angle);
    CV[7] = arc.PointAt(angle0 + 0.875*angle);
    CV[8] = end_point;
		angle *= 0.25;
		break;
	}

	a = cos(0.5*angle);
	b = a - 1.0;
	//c = (radius > 0.0) ? radius*angle : angle;
  c = angle;

	span_count *= 2;
	knot[0] = knot[1] = angle0; //0.0;
	for (j = 1; j < span_count; j += 2) {
    CV[j].x += b * center.x;
    CV[j].y += b * center.y;
    CV[j].z += b * center.z;
    CV[j].w = a;
		CV[j+1].w = 1.0;
		knot[j+1] = knot[j+2] = knot[j-1] + c;
	}
  knot[cv_count-1] = knot[cv_count] = angle1;
  for ( j = 1; j < span_count; j += 2 ) {
    w = CV[j].w;
    winv = 1.0/w;
    a = CV[j].x*winv;
    b = ArcDeFuzz(a);
    if ( a != b ) {
      CV[j].x = b*w;
    }
    a = CV[j].y*winv;
    b = ArcDeFuzz(a);
    if ( a != b ) {
      CV[j].y = b*w;
    }
    a = CV[j].z*winv;
    b = ArcDeFuzz(a);
    if ( a != b ) {
      CV[j].z = b*w;
    }
  }

  nurb.m_dim = (dim==2) ? 2 : 3;
  nurb.m_is_rat = 1;
  nurb.m_order = 3;
  nurb.m_cv_count = cv_count;
  nurb.m_cv_stride = (dim==2 ? 3 : 4);
  nurb.ReserveCVCapacity( nurb.m_cv_stride*cv_count );
  nurb.ReserveKnotCapacity( cv_count+1 );
  for ( j = 0; j < cv_count; j++ ) {
    cv = nurb.CV(j);
    cv[0] = CV[j].x;
    cv[1] = CV[j].y;
    if ( dim == 2 ) {
      cv[2] = CV[j].w;
    }
    else {
      cv[2] = CV[j].z;
      cv[3] = CV[j].w;
    }
    nurb.m_knot[j] = knot[j];
  }
  nurb.m_knot[cv_count] = knot[cv_count];
  return true;
}